

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O2

ZyanStatus
ZydisFormatterFormatOperand
          (ZydisFormatter *formatter,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operand,char *buffer,ZyanUSize length,ZyanU64 runtime_address,
          void *user_data)

{
  ZyanStatus ZVar1;
  int iVar2;
  undefined1 auVar3 [16];
  ZydisFormatterBuffer formatter_buffer;
  ZydisFormatterContext local_a0;
  ZydisFormatterBuffer local_78;
  
  auVar3._0_4_ = -(uint)(formatter == (ZydisFormatter *)0x0);
  auVar3._4_4_ = -(uint)(instruction == (ZydisDecodedInstruction *)0x0);
  auVar3._8_4_ = -(uint)(operand == (ZydisDecodedOperand *)0x0);
  auVar3._12_4_ = -(uint)(buffer == (char *)0x0);
  iVar2 = movmskps((int)operand,auVar3);
  ZVar1 = 0x80100004;
  if (iVar2 == 0 && length != 0) {
    ZydisFormatterBufferInit(&local_78,buffer,length);
    local_a0.operands = (ZydisDecodedOperand *)0x0;
    local_a0.user_data = user_data;
    local_a0.instruction = instruction;
    local_a0.operand = operand;
    local_a0.runtime_address = runtime_address;
    if ((formatter->func_pre_operand == (ZydisFormatterFunc)0x0) ||
       (ZVar1 = (*formatter->func_pre_operand)(formatter,&local_78,&local_a0), -1 < (int)ZVar1)) {
      switch((local_a0.operand)->type) {
      case ZYDIS_OPERAND_TYPE_REGISTER:
        ZVar1 = (*formatter->func_format_operand_reg)(formatter,&local_78,&local_a0);
        break;
      case ZYDIS_OPERAND_TYPE_MEMORY:
        ZVar1 = (*formatter->func_format_operand_mem)(formatter,&local_78,&local_a0);
        break;
      case ZYDIS_OPERAND_TYPE_POINTER:
        ZVar1 = (*formatter->func_format_operand_ptr)(formatter,&local_78,&local_a0);
        break;
      case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        ZVar1 = (*formatter->func_format_operand_imm)(formatter,&local_78,&local_a0);
        break;
      default:
        return 0x80100004;
      }
      if ((-1 < (int)ZVar1) &&
         ((formatter->func_post_operand == (ZydisFormatterFunc)0x0 ||
          (ZVar1 = (*formatter->func_post_operand)(formatter,&local_78,&local_a0), -1 < (int)ZVar1))
         )) {
        ZVar1 = 0x100000;
      }
    }
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZydisFormatterFormatOperand(const ZydisFormatter* formatter,
    const ZydisDecodedInstruction* instruction, const ZydisDecodedOperand* operand,
    char* buffer, ZyanUSize length, ZyanU64 runtime_address, void* user_data)
{
    if (!formatter || !instruction || !operand || !buffer || (length == 0))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZydisFormatterBuffer formatter_buffer;
    ZydisFormatterBufferInit(&formatter_buffer, buffer, length);

    ZydisFormatterContext context;
    context.instruction     = instruction;
    context.operands        = ZYAN_NULL;
    context.runtime_address = runtime_address;
    context.operand         = operand;
    context.user_data       = user_data;

    // We ignore `ZYDIS_STATUS_SKIP_TOKEN` for all operand-functions as it does not make any sense
    // to skip the only operand printed by this function

    if (formatter->func_pre_operand)
    {
        ZYAN_CHECK(formatter->func_pre_operand(formatter, &formatter_buffer, &context));
    }

    switch (context.operand->type)
    {
    case ZYDIS_OPERAND_TYPE_REGISTER:
        ZYAN_CHECK(formatter->func_format_operand_reg(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_MEMORY:
        ZYAN_CHECK(formatter->func_format_operand_mem(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        ZYAN_CHECK(formatter->func_format_operand_imm(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_POINTER:
        ZYAN_CHECK(formatter->func_format_operand_ptr(formatter, &formatter_buffer, &context));
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (formatter->func_post_operand)
    {
        ZYAN_CHECK(formatter->func_post_operand(formatter, &formatter_buffer, &context));
    }

    return ZYAN_STATUS_SUCCESS;
}